

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genmbcs.cpp
# Opt level: O0

UBool MBCSAddToUnicode(MBCSData *mbcsData,uint8_t *bytes,int32_t length,UChar32 c,int8_t flag)

{
  short sVar1;
  ushort uVar2;
  FILE *pFVar3;
  undefined4 uVar4;
  UBool UVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  uint local_4c;
  byte local_45;
  int32_t real;
  uint uStack_40;
  uint8_t state;
  int32_t old;
  int32_t entry;
  int32_t i;
  uint32_t offset;
  char buffer [10];
  int8_t flag_local;
  UChar32 c_local;
  int32_t length_local;
  uint8_t *bytes_local;
  MBCSData *mbcsData_local;
  
  pFVar3 = _stderr;
  entry = 0;
  local_45 = 0;
  buffer[2] = flag;
  buffer._3_4_ = c;
  unique0x100006ed = length;
  if ((mbcsData->ucm->states).countStates == 0) {
    fprintf(_stderr,"error: there is no state information!\n");
    return '\0';
  }
  if ((length == 2) && ((mbcsData->ucm->states).outputType == '\f')) {
    local_45 = 1;
  }
  old = 0;
  while( true ) {
    iVar9 = old + 1;
    uVar6 = (mbcsData->ucm->states).stateTable[local_45][bytes[old]];
    if ((int)uVar6 < 0) break;
    if (iVar9 == length) {
      pcVar7 = printBytes((char *)((long)&i + 1),bytes,length);
      fprintf(pFVar3,"error: byte sequence too short, ends in non-final state %hu: 0x%s (U+%x)\n",
              (ulong)(uint)(int)(short)(ushort)local_45,pcVar7,(ulong)(uint)buffer._3_4_);
      return '\0';
    }
    local_45 = (byte)(uVar6 >> 0x18);
    entry = (uVar6 & 0xffffff) + entry;
    old = iVar9;
  }
  if (iVar9 < length) {
    pcVar7 = printBytes((char *)((long)&i + 1),bytes,length);
    fprintf(pFVar3,"error: byte sequence too long by %d bytes, final state %u: 0x%s (U+%x)\n",
            (ulong)(uint)(length - iVar9),(ulong)local_45,pcVar7,(ulong)(uint)buffer._3_4_);
    return '\0';
  }
  switch(uVar6 >> 0x14 & 0xf) {
  case 0:
  case 1:
  case 2:
  case 3:
    if ((uVar6 & 0x80ffffff) != 0x8000fffe) {
      if (((uVar6 >> 0x14 & 0xf) == 0) || ((uVar6 >> 0x14 & 0xf) == 2)) {
        real = uVar6 & 0xfffff;
      }
      else {
        real = (uVar6 & 0xfffff) + 0x10000;
      }
      if (-1 < flag) {
        pcVar7 = printBytes((char *)((long)&i + 1),bytes,length);
        fprintf(pFVar3,"error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                (ulong)(uint)c,pcVar7,(ulong)(uint)real);
        return '\0';
      }
      if (VERBOSE != '\0') {
        pcVar7 = printBytes((char *)((long)&i + 1),bytes,length);
        fprintf(pFVar3,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                (ulong)(uint)c,pcVar7,(ulong)(uint)real);
      }
    }
    iVar9 = 0;
    if (buffer[2] == '\x03') {
      iVar9 = 2;
    }
    uVar8 = (iVar9 + (uint)(0xffff < (int)buffer._3_4_)) * 0x100000;
    if ((int)buffer._3_4_ < 0x10000) {
      uStack_40 = uVar6 & 0xff000000 | uVar8 | buffer._3_4_;
    }
    else {
      uStack_40 = uVar6 & 0xff000000 | uVar8 | buffer._3_4_ - 0x10000;
    }
    (mbcsData->ucm->states).stateTable[local_45][bytes[old]] = uStack_40;
    goto LAB_00200f30;
  case 4:
    uVar6 = (uVar6 & 0xffff) + entry;
    real = (int32_t)mbcsData->unicodeCodeUnits[uVar6];
    if ((real != 0xfffe) || (real = removeFallback(mbcsData,uVar6), real != -1)) {
      uVar4 = buffer._3_4_;
      pFVar3 = _stderr;
      if (-1 < buffer[2]) {
        pcVar7 = printBytes((char *)((long)&i + 1),bytes,stack0xffffffffffffffdc);
        fprintf(pFVar3,"error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                (ulong)(uint)uVar4,pcVar7,(ulong)(uint)real);
        return '\0';
      }
      if (VERBOSE != '\0') {
        pcVar7 = printBytes((char *)((long)&i + 1),bytes,stack0xffffffffffffffdc);
        fprintf(pFVar3,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                (ulong)(uint)uVar4,pcVar7,(ulong)(uint)real);
      }
    }
    uVar4 = buffer._3_4_;
    pFVar3 = _stderr;
    if (0xffff < (int)buffer._3_4_) {
      pcVar7 = printBytes((char *)((long)&i + 1),bytes,stack0xffffffffffffffdc);
      fprintf(pFVar3,"error: code point does not fit into valid-16-bit state at U+%04x<->0x%s\n",
              (ulong)(uint)uVar4,pcVar7);
      return '\0';
    }
    if (buffer[2] < '\x01') {
      mbcsData->unicodeCodeUnits[uVar6] = (uint16_t)buffer._3_4_;
    }
    else if (mbcsData->unicodeCodeUnits[uVar6] == 0xfffe) {
      UVar5 = setFallback(mbcsData,uVar6,buffer._3_4_);
      return UVar5;
    }
    goto LAB_00200f30;
  case 5:
    uVar6 = (uVar6 & 0xffff) + entry;
    uVar8 = (uint)mbcsData->unicodeCodeUnits[uVar6];
    if (uVar8 < 0xfffe) {
      local_4c = uVar8;
      if (0xd7ff < uVar8) {
        if (uVar8 < 0xe000) {
          local_4c = (uVar8 & 0x3ff) * 0x400 + 0x10000 +
                     (mbcsData->unicodeCodeUnits[uVar6 + 1] & 0x3ff);
        }
        else {
          local_4c = (uint)mbcsData->unicodeCodeUnits[uVar6 + 1];
        }
      }
      if (-1 < flag) {
        pcVar7 = printBytes((char *)((long)&i + 1),bytes,length);
        fprintf(pFVar3,"error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                (ulong)(uint)c,pcVar7,(ulong)local_4c);
        return '\0';
      }
      if (VERBOSE != '\0') {
        pcVar7 = printBytes((char *)((long)&i + 1),bytes,length);
        fprintf(pFVar3,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                (ulong)(uint)c,pcVar7,(ulong)local_4c);
      }
    }
    sVar1 = (short)((int)buffer._3_4_ >> 10);
    uVar2 = (ushort)buffer._3_4_;
    if (buffer[2] < '\x01') {
      if ((int)buffer._3_4_ < 0xd800) {
        mbcsData->unicodeCodeUnits[uVar6] = uVar2;
      }
      else if ((int)buffer._3_4_ < 0x10000) {
        mbcsData->unicodeCodeUnits[uVar6] = 0xe000;
        mbcsData->unicodeCodeUnits[uVar6 + 1] = uVar2;
      }
      else {
        mbcsData->unicodeCodeUnits[uVar6] = sVar1 + 0xd7c0;
        mbcsData->unicodeCodeUnits[uVar6 + 1] = (uVar2 & 0x3ff) + 0xdc00;
      }
    }
    else if ((0xdbff < uVar8) && (uVar8 != 0xe000)) {
      if ((int)buffer._3_4_ < 0x10000) {
        mbcsData->unicodeCodeUnits[uVar6] = 0xe001;
        mbcsData->unicodeCodeUnits[uVar6 + 1] = uVar2;
      }
      else {
        mbcsData->unicodeCodeUnits[uVar6] = sVar1 + 0xdbc0;
        mbcsData->unicodeCodeUnits[uVar6 + 1] = (uVar2 & 0x3ff) + 0xdc00;
      }
    }
LAB_00200f30:
    mbcsData_local._7_1_ = '\x01';
    break;
  case 6:
    pcVar7 = printBytes((char *)((long)&i + 1),bytes,length);
    fprintf(pFVar3,"error: byte sequence ends in unassigned state at U+%04x<->0x%s\n",(ulong)(uint)c
            ,pcVar7);
    mbcsData_local._7_1_ = '\0';
    break;
  case 7:
    pcVar7 = printBytes((char *)((long)&i + 1),bytes,length);
    fprintf(pFVar3,"error: byte sequence ends in illegal state at U+%04x<->0x%s\n",(ulong)(uint)c,
            pcVar7);
    mbcsData_local._7_1_ = '\0';
    break;
  case 8:
    pcVar7 = printBytes((char *)((long)&i + 1),bytes,length);
    fprintf(pFVar3,"error: byte sequence ends in state-change-only at U+%04x<->0x%s\n",
            (ulong)(uint)c,pcVar7);
    mbcsData_local._7_1_ = '\0';
    break;
  default:
    pcVar7 = printBytes((char *)((long)&i + 1),bytes,length);
    fprintf(pFVar3,
            "internal error: byte sequence reached reserved action code, entry 0x%02x: 0x%s (U+%x)\n"
            ,(ulong)uVar6,pcVar7,(ulong)(uint)buffer._3_4_);
    mbcsData_local._7_1_ = '\0';
  }
  return mbcsData_local._7_1_;
}

Assistant:

static UBool
MBCSAddToUnicode(MBCSData *mbcsData,
                 const uint8_t *bytes, int32_t length,
                 UChar32 c,
                 int8_t flag) {
    char buffer[10];
    uint32_t offset=0;
    int32_t i=0, entry, old;
    uint8_t state=0;

    if(mbcsData->ucm->states.countStates==0) {
        fprintf(stderr, "error: there is no state information!\n");
        return FALSE;
    }

    /* for SI/SO (like EBCDIC-stateful), double-byte sequences start in state 1 */
    if(length==2 && mbcsData->ucm->states.outputType==MBCS_OUTPUT_2_SISO) {
        state=1;
    }

    /*
     * Walk down the state table like in conversion,
     * much like getNextUChar().
     * We assume that c<=0x10ffff.
     */
    for(i=0;;) {
        entry=mbcsData->ucm->states.stateTable[state][bytes[i++]];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            if(i==length) {
                fprintf(stderr, "error: byte sequence too short, ends in non-final state %hu: 0x%s (U+%x)\n",
                    (short)state, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);
        } else {
            if(i<length) {
                fprintf(stderr, "error: byte sequence too long by %d bytes, final state %u: 0x%s (U+%x)\n",
                    (int)(length-i), state, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }
            switch(MBCS_ENTRY_FINAL_ACTION(entry)) {
            case MBCS_STATE_ILLEGAL:
                fprintf(stderr, "error: byte sequence ends in illegal state at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_CHANGE_ONLY:
                fprintf(stderr, "error: byte sequence ends in state-change-only at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_UNASSIGNED:
                fprintf(stderr, "error: byte sequence ends in unassigned state at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_FALLBACK_DIRECT_16:
            case MBCS_STATE_VALID_DIRECT_16:
            case MBCS_STATE_FALLBACK_DIRECT_20:
            case MBCS_STATE_VALID_DIRECT_20:
                if(MBCS_ENTRY_SET_STATE(entry, 0)!=MBCS_ENTRY_FINAL(0, MBCS_STATE_VALID_DIRECT_16, 0xfffe)) {
                    /* the "direct" action's value is not "valid-direct-16-unassigned" any more */
                    if(MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_DIRECT_16 || MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_FALLBACK_DIRECT_16) {
                        old=MBCS_ENTRY_FINAL_VALUE(entry);
                    } else {
                        old=0x10000+MBCS_ENTRY_FINAL_VALUE(entry);
                    }
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                    }
                    /*
                     * Continue after the above warning
                     * if the precision of the mapping is unspecified.
                     */
                }
                /* reassign the correct action code */
                entry=MBCS_ENTRY_FINAL_SET_ACTION(entry, (MBCS_STATE_VALID_DIRECT_16+(flag==3 ? 2 : 0)+(c>=0x10000 ? 1 : 0)));

                /* put the code point into bits 22..7 for BMP, c-0x10000 into 26..7 for others */
                if(c<=0xffff) {
                    entry=MBCS_ENTRY_FINAL_SET_VALUE(entry, c);
                } else {
                    entry=MBCS_ENTRY_FINAL_SET_VALUE(entry, c-0x10000);
                }
                mbcsData->ucm->states.stateTable[state][bytes[i-1]]=entry;
                break;
            case MBCS_STATE_VALID_16:
                /* bits 26..16 are not used, 0 */
                /* bits 15..7 contain the final offset delta to one 16-bit code unit */
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                /* check that this byte sequence is still unassigned */
                if((old=mbcsData->unicodeCodeUnits[offset])!=0xfffe || (old=removeFallback(mbcsData, offset))!=-1) {
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                    }
                }
                if(c>=0x10000) {
                    fprintf(stderr, "error: code point does not fit into valid-16-bit state at U+%04x<->0x%s\n",
                        (int)c, printBytes(buffer, bytes, length));
                    return FALSE;
                }
                if(flag>0) {
                    /* assign only if there is no precise mapping */
                    if(mbcsData->unicodeCodeUnits[offset]==0xfffe) {
                        return setFallback(mbcsData, offset, c);
                    }
                } else {
                    mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                }
                break;
            case MBCS_STATE_VALID_16_PAIR:
                /* bits 26..16 are not used, 0 */
                /* bits 15..7 contain the final offset delta to two 16-bit code units */
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                /* check that this byte sequence is still unassigned */
                old=mbcsData->unicodeCodeUnits[offset];
                if(old<0xfffe) {
                    int32_t real;
                    if(old<0xd800) {
                        real=old;
                    } else if(old<=0xdfff) {
                        real=0x10000+((old&0x3ff)<<10)+((mbcsData->unicodeCodeUnits[offset+1])&0x3ff);
                    } else /* old<=0xe001 */ {
                        real=mbcsData->unicodeCodeUnits[offset+1];
                    }
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)real);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)real);
                    }
                }
                if(flag>0) {
                    /* assign only if there is no precise mapping */
                    if(old<=0xdbff || old==0xe000) {
                        /* do nothing */
                    } else if(c<=0xffff) {
                        /* set a BMP fallback code point as a pair with 0xe001 */
                        mbcsData->unicodeCodeUnits[offset++]=0xe001;
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else {
                        /* set a fallback surrogate pair with two second surrogates */
                        mbcsData->unicodeCodeUnits[offset++]=(uint16_t)(0xdbc0+(c>>10));
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)(0xdc00+(c&0x3ff));
                    }
                } else {
                    if(c<0xd800) {
                        /* set a BMP code point */
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else if(c<=0xffff) {
                        /* set a BMP code point above 0xd800 as a pair with 0xe000 */
                        mbcsData->unicodeCodeUnits[offset++]=0xe000;
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else {
                        /* set a surrogate pair */
                        mbcsData->unicodeCodeUnits[offset++]=(uint16_t)(0xd7c0+(c>>10));
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)(0xdc00+(c&0x3ff));
                    }
                }
                break;
            default:
                /* reserved, must never occur */
                fprintf(stderr, "internal error: byte sequence reached reserved action code, entry 0x%02x: 0x%s (U+%x)\n",
                    (int)entry, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }

            return TRUE;
        }
    }
}